

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxRuntime.cpp
# Opt level: O0

void __thiscall Jinx::Impl::Runtime::LogSymbols(Runtime *this,SymbolList *symbolList)

{
  bool bVar1;
  pointer pSVar2;
  char *format;
  uint local_64;
  const_iterator cStack_60;
  uint32_t i;
  __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
  local_58;
  const_iterator symbol;
  String symbolText;
  const_iterator cStack_28;
  int lineCount;
  uint32_t local_20;
  byte local_19;
  int offset;
  bool newLine;
  SymbolList *symbolList_local;
  Runtime *this_local;
  
  _offset = symbolList;
  symbolList_local = (SymbolList *)this;
  LogWriteLine(Info,"\nSymbols:\n====================");
  local_19 = 1;
  local_20 = 0;
  bVar1 = std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::empty(_offset);
  if (!bVar1) {
    cStack_28 = std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::begin
                          (_offset);
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->(&stack0xffffffffffffffd8);
    local_20 = pSVar2->columnNumber;
  }
  symbolText.field_2._12_4_ = 0;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&symbol);
  local_58._M_current =
       (Symbol *)
       std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::begin(_offset);
  while( true ) {
    cStack_60 = std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>::end(_offset);
    bVar1 = __gnu_cxx::operator!=(&local_58,&stack0xffffffffffffffa0);
    if (!bVar1) break;
    if ((local_19 & 1) != 0) {
      local_64 = 1;
      while( true ) {
        pSVar2 = __gnu_cxx::
                 __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
                 ::operator->(&local_58);
        if (pSVar2->columnNumber - local_20 <= local_64) break;
        LogWrite(Info," ");
        local_64 = local_64 + 1;
      }
      local_19 = 0;
    }
    WriteSymbol((SymbolListCItr)local_58._M_current,(String *)&symbol);
    format = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                       ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)
                        &symbol);
    LogWrite(Info,format);
    pSVar2 = __gnu_cxx::
             __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
             ::operator->(&local_58);
    if (pSVar2->type == NewLine) {
      local_19 = 1;
      symbolText.field_2._12_4_ = symbolText.field_2._12_4_ + 1;
    }
    __gnu_cxx::
    __normal_iterator<const_Jinx::Impl::Symbol_*,_std::vector<Jinx::Impl::Symbol,_Jinx::Allocator<Jinx::Impl::Symbol>_>_>
    ::operator++(&local_58);
  }
  LogWrite(Info,"\nLine Count: %i\n\n",(ulong)(uint)symbolText.field_2._12_4_);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)&symbol);
  return;
}

Assistant:

inline_t void Runtime::LogSymbols(const SymbolList & symbolList) const
	{
		LogWriteLine(LogLevel::Info, "\nSymbols:\n====================");
		bool newLine = true;

		// Store offset of first symbol
		auto offset = 0;
		if (!symbolList.empty())
			offset = symbolList.begin()->columnNumber;

		int lineCount = 0;

		String symbolText;

		// Iterate through the symbol list and write everything to the log
		for (auto symbol = symbolList.begin(); symbol != symbolList.end(); ++symbol)
		{
			// Write indentation at each new line
			if (newLine)
			{
				for (uint32_t i = 1; i < symbol->columnNumber - offset; ++i)
					LogWrite(LogLevel::Info, " ");
				newLine = false;
			}

			// Write out / lot symbols
			WriteSymbol(symbol, symbolText);
			LogWrite(LogLevel::Info, symbolText.c_str());

			// Special handling for newlines
			if (symbol->type == SymbolType::NewLine)
			{
				newLine = true;
				++lineCount;
			}

		}
		LogWrite(LogLevel::Info, "\nLine Count: %i\n\n", lineCount);
	}